

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

string * tinyusdz::escapeBackslash
                   (string *__return_storage_ptr__,string *str,bool triple_quoted_string)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  string *s;
  ulong uVar4;
  string bs_escaped;
  string bs;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  if ((int)CONCAT71(in_register_00000011,triple_quoted_string) == 0) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\","");
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\\\\","");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + str->_M_string_length);
    for (uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_50,0);
        uVar3 != 0xffffffffffffffff;
        uVar3 = std::__cxx11::string::find
                          ((char *)__return_storage_ptr__,(ulong)local_50,uVar3 + local_68)) {
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,local_48,(ulong)local_70);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar3 = str->_M_string_length;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pcVar2 = (str->_M_dataplus)._M_p;
        if (pcVar2[uVar4] == '\\') {
          uVar1 = uVar4 + 3;
          if (uVar1 < uVar3) {
            if (pcVar2[uVar4 + 1] == '\"') {
              if ((pcVar2[uVar4 + 2] == '\"') && (pcVar2[uVar1] == '\"')) goto LAB_00162758;
            }
            else if ((pcVar2[uVar4 + 1] == '\'') &&
                    ((pcVar2[uVar4 + 2] == '\'' && (pcVar2[uVar1] == '\'')))) {
LAB_00162758:
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar4 = uVar1;
              goto LAB_0016276d;
            }
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
LAB_0016276d:
        uVar4 = uVar4 + 1;
        uVar3 = str->_M_string_length;
      } while (uVar4 < uVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeBackslash(const std::string &str,
                            const bool triple_quoted_string) {
  if (triple_quoted_string) {
    std::string s;

    // Do not escape \""" or \'''

    for (size_t i = 0; i < str.size(); i++) {
      if (str[i] == '\\') {
        if (i + 3 < str.size()) {
          if ((str[i + 1] == '\'') && (str[i + 2] == '\'') &&
              (str[i + 3] == '\'')) {
            s += "\\'''";
            i += 3;
          } else if ((str[i + 1] == '"') && (str[i + 2] == '"') &&
                     (str[i + 3] == '"')) {
            s += "\\\"\"\"";
            i += 3;
          } else {
            s += "\\\\";
          }
        } else {
          s += "\\\\";
        }
      } else {
        s += str[i];
      }
    }

    return s;
  } else {
    const std::string bs = "\\";
    const std::string bs_escaped = "\\\\";

    std::string s = str;

    std::string::size_type pos = 0;
    while ((pos = s.find(bs, pos)) != std::string::npos) {
      s.replace(pos, bs.length(), bs_escaped);
      pos += bs_escaped.length();
    }

    return s;
  }
}